

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void autoIncrementEnd(Parse *pParse)

{
  byte bVar1;
  int iVar2;
  int p3;
  sqlite3 *psVar3;
  Vdbe *p;
  Db *pDVar4;
  int iVar5;
  VdbeOp *pVVar6;
  Table *pTab;
  AutoincInfo *pAVar7;
  
  psVar3 = pParse->db;
  p = pParse->pVdbe;
  pAVar7 = (AutoincInfo *)&pParse->pAinc;
  while( true ) {
    pAVar7 = pAVar7->pNext;
    if (pAVar7 == (AutoincInfo *)0x0) {
      return;
    }
    pDVar4 = psVar3->aDb;
    iVar2 = pAVar7->iDb;
    p3 = pAVar7->regCtr;
    iVar5 = sqlite3GetTempReg(pParse);
    sqlite3VdbeAddOp3(p,0x37,p3 + 2,p->nOp + 7,p3);
    pTab = (pDVar4[iVar2].pSchema)->pSeqTab;
    sqlite3OpenTable(pParse,0,pAVar7->iDb,pTab,0x6d);
    pVVar6 = sqlite3VdbeAddOpList(p,5,autoIncrementEnd::autoIncEnd,(int)pTab);
    if (pVVar6 == (VdbeOp *)0x0) break;
    iVar2 = p3 + 1;
    pVVar6->p1 = iVar2;
    pVVar6[1].p2 = iVar2;
    pVVar6[2].p1 = p3 + -1;
    pVVar6[2].p3 = iVar5;
    pVVar6[3].p2 = iVar5;
    pVVar6[3].p3 = iVar2;
    pVVar6[3].p5 = 8;
    if (iVar5 != 0) {
      bVar1 = pParse->nTempReg;
      if ((ulong)bVar1 < 8) {
        pParse->nTempReg = bVar1 + 1;
        pParse->aTempReg[bVar1] = iVar5;
      }
    }
  }
  return;
}

Assistant:

static SQLITE_NOINLINE void autoIncrementEnd(Parse *pParse){
  AutoincInfo *p;
  Vdbe *v = pParse->pVdbe;
  sqlite3 *db = pParse->db;

  assert( v );
  for(p = pParse->pAinc; p; p = p->pNext){
    static const int iLn = VDBE_OFFSET_LINENO(2);
    static const VdbeOpList autoIncEnd[] = {
      /* 0 */ {OP_NotNull,     0, 2, 0},
      /* 1 */ {OP_NewRowid,    0, 0, 0},
      /* 2 */ {OP_MakeRecord,  0, 2, 0},
      /* 3 */ {OP_Insert,      0, 0, 0},
      /* 4 */ {OP_Close,       0, 0, 0}
    };
    VdbeOp *aOp;
    Db *pDb = &db->aDb[p->iDb];
    int iRec;
    int memId = p->regCtr;

    iRec = sqlite3GetTempReg(pParse);
    assert( sqlite3SchemaMutexHeld(db, 0, pDb->pSchema) );
    sqlite3VdbeAddOp3(v, OP_Le, memId+2, sqlite3VdbeCurrentAddr(v)+7, memId);
    VdbeCoverage(v);
    sqlite3OpenTable(pParse, 0, p->iDb, pDb->pSchema->pSeqTab, OP_OpenWrite);
    aOp = sqlite3VdbeAddOpList(v, ArraySize(autoIncEnd), autoIncEnd, iLn);
    if( aOp==0 ) break;
    aOp[0].p1 = memId+1;
    aOp[1].p2 = memId+1;
    aOp[2].p1 = memId-1;
    aOp[2].p3 = iRec;
    aOp[3].p2 = iRec;
    aOp[3].p3 = memId+1;
    aOp[3].p5 = OPFLAG_APPEND;
    sqlite3ReleaseTempReg(pParse, iRec);
  }
}